

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O0

int archive_write_disk_set_standard_lookup(archive *a)

{
  _func_void_void_ptr *cleanup_gid;
  void *__s;
  _func_int64_t_void_ptr_char_ptr_int64_t *in_RDI;
  bucket *gcache;
  bucket *ucache;
  
  cleanup_gid = (_func_void_void_ptr *)malloc(0x7f0);
  __s = malloc(0x7f0);
  memset(cleanup_gid,0,0x7f0);
  memset(__s,0,0x7f0);
  archive_write_disk_set_group_lookup((archive *)ucache,gcache,in_RDI,cleanup_gid);
  archive_write_disk_set_user_lookup((archive *)ucache,gcache,in_RDI,cleanup_gid);
  return 0;
}

Assistant:

int
archive_write_disk_set_standard_lookup(struct archive *a)
{
	struct bucket *ucache = malloc(cache_size * sizeof(struct bucket));
	struct bucket *gcache = malloc(cache_size * sizeof(struct bucket));
	memset(ucache, 0, cache_size * sizeof(struct bucket));
	memset(gcache, 0, cache_size * sizeof(struct bucket));
	archive_write_disk_set_group_lookup(a, gcache, lookup_gid, cleanup);
	archive_write_disk_set_user_lookup(a, ucache, lookup_uid, cleanup);
	return (ARCHIVE_OK);
}